

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::uDot(Forth *this)

{
  uint uVar1;
  Cell CVar2;
  _Setbase _Var3;
  ostream *poVar4;
  Cell value;
  Forth *this_local;
  
  requireDStackDepth(this,1,"U.");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  if (this->writeToTarget == ToString) {
    CVar2 = getNumericBase(this);
    _Var3 = std::setbase(CVar2);
    poVar4 = std::operator<<((ostream *)&this->field_0x20,_Var3);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
    std::operator<<(poVar4," ");
  }
  else if (this->writeToTarget == ToStdCout) {
    CVar2 = getNumericBase(this);
    _Var3 = std::setbase(CVar2);
    poVar4 = std::operator<<((ostream *)&std::cout,_Var3);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
    std::operator<<(poVar4," ");
    std::ostream::flush();
  }
  return;
}

Assistant:

void uDot() {
			REQUIRE_DSTACK_DEPTH(1, "U.");
			auto value = static_cast<Cell>(dStack.getTop()); pop();
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			
			switch (writeToTarget) {
			case ToString:
				std_cout << SETBASE() << value << " ";
				break;
			case ToStdCout:
				std::cout << SETBASE() << value << " ";
				std::cout.flush();
				break;
			default:
				break;
			}
#endif
		}